

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

bool __thiscall QMimeGlobPattern::matchFileName(QMimeGlobPattern *this,QString *inputFileName)

{
  QStringView pattern;
  bool bVar1;
  bool bVar2;
  QChar QVar3;
  QChar QVar4;
  QChar QVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  ulong uVar8;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool lastCharOK;
  int cnt_1;
  QChar *c2_1;
  QChar *c1_1;
  int cnt;
  QChar *c2;
  QChar *c1;
  qsizetype fileNameLength;
  qsizetype patternLength;
  QRegularExpression rx;
  QChar lastChar;
  QString fileName;
  undefined4 in_stack_fffffffffffffe78;
  WildcardConversionOption in_stack_fffffffffffffe7c;
  QStringView *in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8a;
  undefined1 in_stack_fffffffffffffe8b;
  undefined4 in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined2 in_stack_fffffffffffffe96;
  undefined2 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9a;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  qsizetype in_stack_fffffffffffffea0;
  qsizetype in_stack_fffffffffffffea8;
  CaseSensitivity cs;
  bool local_149;
  MatchType matchType;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int iVar9;
  QRegularExpression *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  QFlagsStorage<QRegularExpression::WildcardConversionOption> options;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  storage_type_conflict *in_stack_fffffffffffffef8;
  QFlagsStorage<QRegularExpression::MatchOption> in_stack_ffffffffffffff0c;
  bool local_bd;
  QChar local_5e;
  QChar local_5c;
  char16_t local_5a;
  QLatin1StringView local_58;
  QStringView local_38;
  char16_t local_26;
  char16_t local_24;
  char16_t local_22;
  QString local_20;
  long local_8;
  
  options.i = (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  if (*(int *)((long)&in_RDI[2].d.d + 4) == 0) {
    QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffe80,
                     (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  qVar6 = QString::size(in_RDI);
  if (qVar6 == 0) {
    local_bd = false;
    goto LAB_008edea4;
  }
  qVar7 = QString::size(&local_20);
  uVar8 = (ulong)*(uint *)&in_RDI[2].d.ptr;
  switch(uVar8) {
  case 0:
    if (qVar7 + 1 < qVar6) {
      local_bd = false;
    }
    else {
      QString::unicode((QString *)0x8ed84a);
      QString::unicode((QString *)0x8ed878);
      iVar9 = 1;
      while( true ) {
        local_149 = false;
        if (iVar9 < qVar6) {
          local_149 = ::operator==((QChar *)in_stack_fffffffffffffe80,
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78));
        }
        if (local_149 == false) break;
        iVar9 = iVar9 + 1;
      }
      local_bd = iVar9 == qVar6;
    }
    break;
  case 1:
    if (qVar7 + 1 < qVar6) {
      local_bd = false;
    }
    else {
      QString::unicode((QString *)0x8ed987);
      QString::unicode((QString *)0x8ed9a5);
      iVar9 = 1;
      while( true ) {
        bVar1 = false;
        if (iVar9 < qVar6) {
          bVar1 = ::operator==((QChar *)in_stack_fffffffffffffe80,
                               (QChar *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ));
        }
        if (bVar1 == false) break;
        iVar9 = iVar9 + 1;
      }
      local_bd = iVar9 == qVar6;
    }
    break;
  case 2:
    local_bd = ::operator==((QString *)in_stack_fffffffffffffe80,
                            (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                           );
    break;
  case 3:
    local_bd = false;
    if (qVar7 == 7) {
      QVar5 = QString::at((QString *)
                          CONCAT44(in_stack_fffffffffffffe8c,
                                   CONCAT13(in_stack_fffffffffffffe8b,
                                            CONCAT12(in_stack_fffffffffffffe8a,
                                                     in_stack_fffffffffffffe88))),
                          (qsizetype)in_stack_fffffffffffffe80);
      local_22 = QVar5.ucs;
      bVar1 = QChar::isDigit((QChar *)0x8edab0);
      local_bd = false;
      if (bVar1) {
        QVar3 = QString::at((QString *)
                            CONCAT44(in_stack_fffffffffffffe8c,
                                     CONCAT13(in_stack_fffffffffffffe8b,
                                              CONCAT12(in_stack_fffffffffffffe8a,
                                                       in_stack_fffffffffffffe88))),
                            (qsizetype)in_stack_fffffffffffffe80);
        local_24 = QVar3.ucs;
        bVar1 = QChar::isDigit((QChar *)0x8edaf5);
        local_bd = false;
        if (bVar1) {
          QVar4 = QString::at((QString *)
                              CONCAT44(in_stack_fffffffffffffe8c,
                                       CONCAT13(in_stack_fffffffffffffe8b,
                                                CONCAT12(in_stack_fffffffffffffe8a,
                                                         in_stack_fffffffffffffe88))),
                              (qsizetype)in_stack_fffffffffffffe80);
          local_26 = QVar4.ucs;
          bVar1 = QChar::isDigit((QChar *)0x8edb3a);
          local_bd = false;
          if (bVar1) {
            QStringView::QStringView<QString,_true>
                      ((QStringView *)
                       CONCAT26(in_stack_fffffffffffffe96,
                                CONCAT15(in_stack_fffffffffffffe95,
                                         CONCAT14(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90))),
                       (QString *)
                       CONCAT44(in_stack_fffffffffffffe8c,
                                CONCAT13(in_stack_fffffffffffffe8b,
                                         CONCAT12(in_stack_fffffffffffffe8a,
                                                  in_stack_fffffffffffffe88))));
            local_38 = QStringView::mid((QStringView *)
                                        CONCAT17(in_stack_fffffffffffffe9f,
                                                 CONCAT16(local_bd,CONCAT24(QVar5.ucs,
                                                                            CONCAT22(QVar3.ucs,
                                                                                     QVar4.ucs)))),
                                        in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
            local_58 = Qt::Literals::StringLiterals::operator____L1
                                 ((char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   CONCAT13(in_stack_fffffffffffffe8b,
                                                            CONCAT12(in_stack_fffffffffffffe8a,
                                                                     in_stack_fffffffffffffe88))),
                                  (size_t)in_stack_fffffffffffffe80);
            local_bd = ::operator==(in_stack_fffffffffffffe80,
                                    (QLatin1StringView *)
                                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          }
        }
      }
    }
    break;
  case 4:
    if (qVar7 < 6) {
      local_bd = false;
      break;
    }
    local_5a = 0xaaaa;
    QVar5 = QString::at((QString *)
                        CONCAT44(in_stack_fffffffffffffe8c,
                                 CONCAT13(in_stack_fffffffffffffe8b,
                                          CONCAT12(in_stack_fffffffffffffe8a,
                                                   in_stack_fffffffffffffe88))),
                        (qsizetype)in_stack_fffffffffffffe80);
    local_5a = QVar5.ucs;
    bVar1 = QChar::isDigit((QChar *)0x8edc42);
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_5c,L'0');
      bVar1 = ::operator!=((QChar *)in_stack_fffffffffffffe80,
                           (QChar *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      bVar2 = true;
      if (!bVar1) goto LAB_008edc7c;
    }
    else {
LAB_008edc7c:
      QChar::QChar<char16_t,_true>(&local_5e,L'j');
      bVar2 = ::operator==((QChar *)in_stack_fffffffffffffe80,
                           (QChar *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_bd = false;
    if (bVar2 != false) {
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT26(QVar5.ucs,CONCAT15(bVar2,(uint5)in_stack_fffffffffffffe90))
                 ,(QString *)
                  CONCAT44(in_stack_fffffffffffffe8c,
                           CONCAT13(in_stack_fffffffffffffe8b,
                                    CONCAT12(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88))))
      ;
      QStringView::mid((QStringView *)
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  CONCAT22(in_stack_fffffffffffffe9a,
                                                           in_stack_fffffffffffffe98)))),
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,
                                  CONCAT13(in_stack_fffffffffffffe8b,
                                           CONCAT12(in_stack_fffffffffffffe8a,
                                                    in_stack_fffffffffffffe88))),
                 (size_t)in_stack_fffffffffffffe80);
      local_bd = ::operator==(in_stack_fffffffffffffe80,
                              (QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    break;
  case 5:
    QStringView::QStringView<QString,_true>
              ((QStringView *)
               CONCAT26(in_stack_fffffffffffffe96,
                        CONCAT15(in_stack_fffffffffffffe95,
                                 CONCAT14(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))),
               (QString *)
               CONCAT44(in_stack_fffffffffffffe8c,
                        CONCAT13(in_stack_fffffffffffffe8b,
                                 CONCAT12(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88))));
    matchType = (MatchType)(uVar8 >> 0x20);
    cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    QFlags<QRegularExpression::WildcardConversionOption>::QFlags
              ((QFlags<QRegularExpression::WildcardConversionOption> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    pattern.m_size._4_4_ = in_stack_fffffffffffffef4;
    pattern.m_size._0_4_ = in_stack_fffffffffffffef0;
    pattern.m_data = in_stack_fffffffffffffef8;
    QRegularExpression::fromWildcard(pattern,cs,(WildcardConversionOptions)options.i);
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    QRegularExpression::match
              (in_stack_fffffffffffffee0,
               (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (qsizetype)in_RDI,matchType,(MatchOptions)in_stack_ffffffffffffff0c.i);
    local_bd = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x8ede09);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x8ede29);
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x8ede41);
    break;
  default:
    local_bd = false;
  }
LAB_008edea4:
  QString::~QString((QString *)0x8edeb1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_bd;
}

Assistant:

bool QMimeGlobPattern::matchFileName(const QString &inputFileName) const
{
    // "Applications MUST match globs case-insensitively, except when the case-sensitive
    // attribute is set to true."
    // The constructor takes care of putting case-insensitive patterns in lowercase.
    const QString fileName = m_caseSensitivity == Qt::CaseInsensitive
            ? inputFileName.toLower() : inputFileName;

    const qsizetype patternLength = m_pattern.size();
    if (!patternLength)
        return false;
    const qsizetype fileNameLength = fileName.size();

    switch (m_patternType) {
    case SuffixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode() + patternLength - 1;
        const QChar *c2 = fileName.unicode() + fileNameLength - 1;
        int cnt = 1;
        while (cnt < patternLength && *c1-- == *c2--)
            ++cnt;
        return cnt == patternLength;
    }
    case PrefixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode();
        const QChar *c2 = fileName.unicode();
        int cnt = 1;
        while (cnt < patternLength && *c1++ == *c2++)
           ++cnt;
        return cnt == patternLength;
    }
    case LiteralPattern:
        return (m_pattern == fileName);
    case VdrPattern: // "[0-9][0-9][0-9].vdr" case
        return fileNameLength == 7
                && fileName.at(0).isDigit() && fileName.at(1).isDigit() && fileName.at(2).isDigit()
                && QStringView{fileName}.mid(3, 4) == ".vdr"_L1;
    case AnimPattern: { // "*.anim[1-9j]" case
        if (fileNameLength < 6)
            return false;
        const QChar lastChar = fileName.at(fileNameLength - 1);
        const bool lastCharOK = (lastChar.isDigit() && lastChar != u'0')
                              || lastChar == u'j';
        return lastCharOK && QStringView{fileName}.mid(fileNameLength - 6, 5) == ".anim"_L1;
    }
    case OtherPattern:
        // Other fallback patterns: slow but correct method
#if QT_CONFIG(regularexpression)
        auto rx = QRegularExpression::fromWildcard(m_pattern);
        return rx.match(fileName).hasMatch();
#else
        return false;
#endif
    }
    return false;
}